

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int user_callback_handle_rxflow
              (lws_callback_function *callback_function,lws *wsi,lws_callback_reasons reason,
              void *user,void *in,size_t len)

{
  int local_3c;
  int n;
  size_t len_local;
  void *in_local;
  void *user_local;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  lws_callback_function *callback_function_local;
  
  *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffff7fffffff | 0x80000000;
  local_3c = (*callback_function)(wsi,reason,user,in,len);
  *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffff7fffffff;
  if (local_3c == 0) {
    local_3c = __lws_rx_flow_control(wsi);
  }
  return local_3c;
}

Assistant:

int user_callback_handle_rxflow(lws_callback_function callback_function,
				struct lws *wsi,
				enum lws_callback_reasons reason, void *user,
				void *in, size_t len)
{
	int n;

	wsi->rxflow_will_be_applied = 1;
	n = callback_function(wsi, reason, user, in, len);
	wsi->rxflow_will_be_applied = 0;
	if (!n)
		n = __lws_rx_flow_control(wsi);

	return n;
}